

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

CanFocus Rml::anon_unknown_0::CanFocusElement(Element *element)

{
  bool bVar1;
  Focus FVar2;
  TabIndex TVar3;
  ComputedValues *this;
  ComputedValues *computed;
  Element *element_local;
  
  bVar1 = Element::IsVisible(element,false);
  if (bVar1) {
    this = Element::GetComputedValues(element);
    FVar2 = Style::ComputedValues::focus(this);
    if (FVar2 == None) {
      element_local._4_4_ = NoAndNoChildren;
    }
    else {
      TVar3 = Style::ComputedValues::tab_index(this);
      if (TVar3 == Auto) {
        element_local._4_4_ = Yes;
      }
      else {
        element_local._4_4_ = No;
      }
    }
  }
  else {
    element_local._4_4_ = NoAndNoChildren;
  }
  return element_local._4_4_;
}

Assistant:

CanFocus CanFocusElement(Element* element)
	{
		if (!element->IsVisible())
			return CanFocus::NoAndNoChildren;

		const ComputedValues& computed = element->GetComputedValues();

		if (computed.focus() == Style::Focus::None)
			return CanFocus::NoAndNoChildren;

		if (computed.tab_index() == Style::TabIndex::Auto)
			return CanFocus::Yes;

		return CanFocus::No;
	}